

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_test.c
# Opt level: O1

void test_url_decode(void)

{
  size_t sVar1;
  uint8_t local_48 [2];
  char cStack_46;
  char cStack_45;
  uint8_t out [16];
  
  _local_48 = CONCAT13(0x78,_local_48);
  sVar1 = nni_url_decode(local_48,"abc",3);
  acutest_check_((uint)(sVar1 == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1a3,"%s","len == 3");
  acutest_check_((uint)(cStack_46 == 'c' && (short)_local_48 == 0x6261),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1a4,"%s","memcmp(out, \"abc\", 3) == 0");
  acutest_check_((uint)(cStack_45 == 'x'),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1a5,"%s","out[3] == \'x\'");
  sVar1 = nni_url_decode(local_48,"x%00y",3);
  acutest_check_((uint)(sVar1 == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1a8,"%s","len == 3");
  acutest_check_((uint)(cStack_46 == 'y' && (short)_local_48 == 0x78),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1a9,"%s","memcmp(out, \"x\\x00y\", 3) == 0");
  acutest_check_((uint)(cStack_45 == 'x'),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1aa,"%s","out[3] == \'x\'");
  sVar1 = nni_url_decode(local_48,"%3987",3);
  acutest_check_((uint)(sVar1 == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1ad,"%s","len == 3");
  acutest_check_((uint)(cStack_46 == '7' && (short)_local_48 == 0x3839),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1ae,"%s","memcmp(out, \"987\", 3) == 0");
  acutest_check_((uint)(cStack_45 == 'x'),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1af,"%s","out[3] == \'x\'");
  sVar1 = nni_url_decode(local_48,"78%39",3);
  acutest_check_((uint)(sVar1 == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1b2,"%s","len == 3");
  acutest_check_((uint)(cStack_46 == '9' && (short)_local_48 == 0x3837),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1b3,"%s","memcmp(out, \"789\", 3) == 0");
  acutest_check_((uint)(cStack_45 == 'x'),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1b4,"%s","out[3] == \'x\'");
  sVar1 = nni_url_decode(local_48,"",5);
  acutest_check_((uint)(sVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1b7,"%s","len == 0");
  acutest_check_((uint)(cStack_46 == '9' && (short)_local_48 == 0x3837),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1b8,"%s","memcmp(out, \"789\", 3) == 0");
  acutest_check_((uint)(cStack_45 == 'x'),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1b9,"%s","out[3] == \'x\'");
  sVar1 = nni_url_decode(local_48,"be",2);
  acutest_check_((uint)(sVar1 == 2),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1bc,"%s","len == 2");
  acutest_check_((uint)(cStack_46 == '9' && (short)_local_48 == 0x6562),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1bd,"%s","memcmp(out, \"be9\", 3) == 0");
  acutest_check_((uint)(cStack_45 == 'x'),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1be,"%s","out[3] == \'x\'");
  sVar1 = nni_url_decode(local_48,"78%39",2);
  acutest_check_((uint)(sVar1 == 0xffffffffffffffff),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1c1,"%s","len == (size_t) -1");
  sVar1 = nni_url_decode(local_48,"",2);
  acutest_check_((uint)(sVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1c4,"%s","len == 0");
  sVar1 = nni_url_decode(local_48,"78%",5);
  acutest_check_((uint)(sVar1 == 0xffffffffffffffff),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1c7,"%s","len == (size_t) -1");
  sVar1 = nni_url_decode(local_48,"78%xy",5);
  acutest_check_((uint)(sVar1 == 0xffffffffffffffff),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1ca,"%s","len == (size_t) -1");
  sVar1 = nni_url_decode(local_48,"78%1$",5);
  acutest_check_((uint)(sVar1 == 0xffffffffffffffff),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1cd,"%s","len == (size_t) -1");
  sVar1 = nni_url_decode(local_48,"%%20",5);
  acutest_check_((uint)(sVar1 == 0xffffffffffffffff),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/url_test.c"
                 ,0x1d0,"%s","len == (size_t) -1");
  return;
}

Assistant:

void
test_url_decode(void)
{
	uint8_t out[16];
	size_t  len;

	out[3] = 'x';
	len    = nni_url_decode(out, "abc", 3);
	NUTS_TRUE(len == 3);
	NUTS_TRUE(memcmp(out, "abc", 3) == 0);
	NUTS_TRUE(out[3] == 'x');

	len = nni_url_decode(out, "x%00y", 3); // embedded NULL
	NUTS_TRUE(len == 3);
	NUTS_TRUE(memcmp(out, "x\x00y", 3) == 0);
	NUTS_TRUE(out[3] == 'x');

	len = nni_url_decode(out, "%3987", 3);
	NUTS_TRUE(len == 3);
	NUTS_TRUE(memcmp(out, "987", 3) == 0);
	NUTS_TRUE(out[3] == 'x');

	len = nni_url_decode(out, "78%39", 3);
	NUTS_TRUE(len == 3);
	NUTS_TRUE(memcmp(out, "789", 3) == 0);
	NUTS_TRUE(out[3] == 'x');

	len = nni_url_decode(out, "", 5);
	NUTS_TRUE(len == 0);
	NUTS_TRUE(memcmp(out, "789", 3) == 0);
	NUTS_TRUE(out[3] == 'x');

	len = nni_url_decode(out, "be", 2);
	NUTS_TRUE(len == 2);
	NUTS_TRUE(memcmp(out, "be9", 3) == 0);
	NUTS_TRUE(out[3] == 'x');

	len = nni_url_decode(out, "78%39", 2);
	NUTS_TRUE(len == (size_t) -1);

	len = nni_url_decode(out, "", 2);
	NUTS_TRUE(len == 0);

	len = nni_url_decode(out, "78%", 5);
	NUTS_TRUE(len == (size_t) -1);

	len = nni_url_decode(out, "78%xy", 5);
	NUTS_TRUE(len == (size_t) -1);

	len = nni_url_decode(out, "78%1$", 5);
	NUTS_TRUE(len == (size_t) -1);

	len = nni_url_decode(out, "%%20", 5);
	NUTS_TRUE(len == (size_t) -1);
}